

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O0

ref<immutable::rrb<int,_false,_6>_> __thiscall
immutable::rrb_update<int,false,6>
          (immutable *this,ref<immutable::rrb<int,_false,_6>_> *in,uint32_t index,int element)

{
  uint32_t uVar1;
  rrb<int,_false,_6> *prVar2;
  leaf_node<int,_false> *plVar3;
  internal_node<int,_false> *piVar4;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_78;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_70;
  ref<immutable::rrb_details::leaf_node<int,_false>_> leaf;
  uint32_t child_index;
  uint32_t local_54;
  ref<immutable::rrb_details::internal_node<int,_false>_> rStack_50;
  uint32_t shift;
  ref<immutable::rrb_details::internal_node<int,_false>_> current;
  ref<immutable::rrb_details::internal_node<int,_false>_> *previous_pointer;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_30;
  ref<immutable::rrb_details::leaf_node<int,_false>_> new_tail;
  uint32_t tail_offset;
  uint32_t local_1c;
  int element_local;
  uint32_t index_local;
  ref<immutable::rrb<int,_false,_6>_> *in_local;
  ref<immutable::rrb<int,_false,_6>_> *new_rrb;
  
  local_1c = index;
  _element_local = in;
  in_local = (ref<immutable::rrb<int,_false,_6>_> *)this;
  prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(in);
  if (index < prVar2->cnt) {
    new_tail.ptr._7_1_ = 0;
    prVar2 = rrb_details::rrb_head_clone<int,false,6>(_element_local->ptr);
    ref<immutable::rrb<int,_false,_6>_>::ref((ref<immutable::rrb<int,_false,_6>_> *)this,prVar2);
    prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(_element_local);
    uVar1 = prVar2->cnt;
    prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(_element_local);
    new_tail.ptr._0_4_ = uVar1 - prVar2->tail_len;
    if (local_1c < (uint)new_tail.ptr) {
      prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->
                         ((ref<immutable::rrb<int,_false,_6>_> *)this);
      current.ptr = (internal_node<int,_false> *)&prVar2->root;
      prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(_element_local);
      ref<immutable::rrb_details::internal_node<int,false>>::
      ref<immutable::rrb_details::tree_node<int,false>>
                ((ref<immutable::rrb_details::internal_node<int,false>> *)&stack0xffffffffffffffb0,
                 &prVar2->root);
      prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(_element_local);
      for (local_54 = prVar2->shift; local_54 != 0; local_54 = local_54 - 6) {
        piVar4 = rrb_details::internal_node_clone<int,false>(rStack_50.ptr);
        ref<immutable::rrb_details::internal_node<int,_false>_>::ref
                  ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                   &stack0xffffffffffffffa0,piVar4);
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  (&stack0xffffffffffffffb0,
                   (ref<immutable::rrb_details::internal_node<int,_false>_> *)
                   &stack0xffffffffffffffa0);
        ref<immutable::rrb_details::internal_node<int,_false>_>::~ref
                  ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                   &stack0xffffffffffffffa0);
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,_false>_> *)current.ptr,
                   &stack0xffffffffffffffb0);
        piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                           (&stack0xffffffffffffffb0);
        if ((piVar4->size_table).ptr == (rrb_size_table<false> *)0x0) {
          leaf.ptr._4_4_ = local_1c >> ((byte)local_54 & 0x1f) & 0x3f;
        }
        else {
          leaf.ptr._4_4_ = rrb_details::sized_pos<int,false>(rStack_50.ptr,&local_1c,local_54);
        }
        piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                           (&stack0xffffffffffffffb0);
        current.ptr = (internal_node<int,_false> *)(piVar4->child + leaf.ptr._4_4_);
        piVar4 = ref<immutable::rrb_details::internal_node<int,_false>_>::operator->
                           (&stack0xffffffffffffffb0);
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  (&stack0xffffffffffffffb0,piVar4->child + leaf.ptr._4_4_);
      }
      ref<immutable::rrb_details::leaf_node<int,false>>::
      ref<immutable::rrb_details::internal_node<int,false>>
                ((ref<immutable::rrb_details::leaf_node<int,false>> *)&local_70,
                 &stack0xffffffffffffffb0);
      plVar3 = rrb_details::leaf_node_clone<int,false>(local_70.ptr);
      ref<immutable::rrb_details::leaf_node<int,_false>_>::ref(&local_78,plVar3);
      ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(&local_70,&local_78);
      ref<immutable::rrb_details::leaf_node<int,_false>_>::~ref(&local_78);
      ref<immutable::rrb_details::internal_node<int,false>>::operator=
                ((ref<immutable::rrb_details::internal_node<int,false>> *)current.ptr,&local_70);
      plVar3 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->(&local_70);
      plVar3->child[local_1c & 0x3f] = element;
      new_tail.ptr._7_1_ = 1;
      ref<immutable::rrb_details::leaf_node<int,_false>_>::~ref(&local_70);
      ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&stack0xffffffffffffffb0);
    }
    else {
      prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->(_element_local);
      plVar3 = rrb_details::leaf_node_clone<int,false>((prVar2->tail).ptr);
      ref<immutable::rrb_details::leaf_node<int,_false>_>::ref(&local_30,plVar3);
      plVar3 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->(&local_30);
      plVar3->child[local_1c - (uint)new_tail.ptr] = element;
      prVar2 = ref<immutable::rrb<int,_false,_6>_>::operator->
                         ((ref<immutable::rrb<int,_false,_6>_> *)this);
      ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(&prVar2->tail,&local_30);
      new_tail.ptr._7_1_ = 1;
      ref<immutable::rrb_details::leaf_node<int,_false>_>::~ref(&local_30);
    }
    if ((new_tail.ptr._7_1_ & 1) == 0) {
      ref<immutable::rrb<int,_false,_6>_>::~ref((ref<immutable::rrb<int,_false,_6>_> *)this);
    }
    return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
  }
  __assert_fail("index < in->cnt",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x79b,
                "ref<rrb<T, atomic_ref_counting, N>> immutable::rrb_update(const ref<rrb<T, atomic_ref_counting, N>> &, uint32_t, T) [T = int, atomic_ref_counting = false, N = 6]"
               );
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> rrb_update(const ref<rrb<T, atomic_ref_counting, N>>& in, uint32_t index, T element)
    {
    using namespace rrb_details;
    assert(index < in->cnt);
    ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_head_clone(in.ptr);
    const uint32_t tail_offset = in->cnt - in->tail_len;
    if (tail_offset <= index)
      {
      ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_clone(in->tail.ptr);
      new_tail->child[index - tail_offset] = std::move(element);
      new_rrb->tail = new_tail;
      return new_rrb;
      }
    ref<internal_node<T, atomic_ref_counting>>* previous_pointer = (ref<internal_node<T, atomic_ref_counting>>*)&new_rrb->root;
    ref<internal_node<T, atomic_ref_counting>> current = in->root;
    for (uint32_t shift = in->shift; shift > 0; shift -= bits<N>::rrb_bits)
      {
      current = internal_node_clone(current.ptr);
      *previous_pointer = current;

      uint32_t child_index;
      if (current->size_table.ptr == nullptr)
        {
        child_index = (index >> shift) & bits<N>::rrb_mask;
        }
      else
        {
        child_index = sized_pos(current.ptr, &index, shift);
        }
      previous_pointer = &current->child[child_index];
      current = current->child[child_index];
      }
    ref<leaf_node<T, atomic_ref_counting>> leaf = current;
    leaf = leaf_node_clone(leaf.ptr);
    *previous_pointer = leaf;
    leaf->child[index & bits<N>::rrb_mask] = std::move(element);
    return new_rrb;
    }